

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearDriveline::ArchiveIN
          (ChLinkMotorLinearDriveline *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_c0;
  ChNameValue<std::shared_ptr<chrono::ChShaftsBody>_> local_a8;
  ChNameValue<std::shared_ptr<chrono::ChShaftsBodyTranslation>_> local_90;
  ChNameValue<std::shared_ptr<chrono::ChShaftsBodyTranslation>_> local_78;
  ChNameValue<std::shared_ptr<chrono::ChShaft>_> local_60;
  ChNameValue<std::shared_ptr<chrono::ChShaft>_> local_48;
  ChNameValue<std::shared_ptr<chrono::ChShaft>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChLinkMotorLinearDriveline>(marchive);
  ChLinkMotorLinear::ArchiveIN(&this->super_ChLinkMotorLinear,marchive);
  local_30._value = (shared_ptr<chrono::ChShaft> *)&(this->super_ChLinkMotorLinear).field_0x278;
  local_30._name = "innershaft1lin";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->innershaft2lin;
  local_48._name = "innershaft2lin";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->innershaft2rot;
  local_60._name = "innershaft2rot";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->innerconstraint1lin;
  local_78._name = "innerconstraint1lin";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  local_90._value = &this->innerconstraint2lin;
  local_90._name = "innerconstraint2lin";
  local_90._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_90);
  local_a8._value = &this->innerconstraint2rot;
  local_a8._name = "innerconstraint2rot";
  local_a8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_a8);
  local_c0._value = &this->shaft2_rotation_dir;
  local_c0._name = "shaft2_rotation_dir";
  local_c0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_c0);
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMotorLinearDriveline>();

    // deserialize parent class
    ChLinkMotorLinear::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(innershaft1lin);
    marchive >> CHNVP(innershaft2lin);
    marchive >> CHNVP(innershaft2rot);
    marchive >> CHNVP(innerconstraint1lin);
    marchive >> CHNVP(innerconstraint2lin);
    marchive >> CHNVP(innerconstraint2rot);
    marchive >> CHNVP(shaft2_rotation_dir);
}